

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeMovetoUnpacked
              (BtCursor *pCur,UnpackedRecord *pIdxKey,i64 intKey,int biasRight,int *pRes)

{
  char cVar1;
  byte bVar2;
  u8 uVar3;
  ushort uVar4;
  KeyInfo *pKVar5;
  MemPage *pMVar6;
  u8 *puVar7;
  u8 *puVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  byte *pbVar13;
  uchar *pBuf;
  ulong uVar14;
  u32 amt;
  uint uVar15;
  u8 *p;
  uint uVar16;
  bool bVar17;
  i64 nCellKey;
  code *local_88;
  u64 local_38;
  
  if (pIdxKey == (UnpackedRecord *)0x0) {
    if ((pCur->eState == '\x01') && ((pCur->curFlags & 2) != 0)) {
      lVar9 = (pCur->info).nKey;
      if (lVar9 == intKey) {
        *pRes = 0;
        return 0;
      }
      if (lVar9 < intKey) {
        if ((pCur->curFlags & 8) != 0) goto LAB_00136821;
        if ((lVar9 + 1 == intKey) && (pCur->skipNext == 0)) {
          *pRes = 0;
          iVar10 = sqlite3BtreeNext(pCur,pRes);
          if (iVar10 != 0) {
            return iVar10;
          }
          local_88 = (code *)0x0;
          if ((*pRes == 0) && (getCellInfo(pCur), (pCur->info).nKey == intKey)) {
            return 0;
          }
          goto LAB_0013645d;
        }
      }
    }
    local_88 = (code *)0x0;
  }
  else {
    pKVar5 = pIdxKey->pKeyInfo;
    local_88 = sqlite3VdbeRecordCompare;
    if ((uint)pKVar5->nXField + (uint)pKVar5->nField < 0xe) {
      uVar4 = pIdxKey->aMem->flags;
      bVar17 = *pKVar5->aSortOrder == '\0';
      pIdxKey->r1 = -bVar17 | 1;
      pIdxKey->r2 = -!bVar17 | 1;
      if ((uVar4 & 4) == 0) {
        if (((uVar4 & 0x19) == 0) &&
           (local_88 = sqlite3VdbeRecordCompare, pKVar5->aColl[0] == (CollSeq *)0x0)) {
          local_88 = vdbeRecordCompareString;
        }
      }
      else {
        local_88 = vdbeRecordCompareInt;
      }
    }
    pIdxKey->errCode = '\0';
  }
LAB_0013645d:
  iVar10 = moveToRoot(pCur);
  if (iVar10 != 0) {
    return iVar10;
  }
  if (pCur->eState != '\0') {
LAB_001364a4:
    cVar1 = pCur->iPage;
    pMVar6 = pCur->apPage[cVar1];
    iVar10 = pMVar6->nCell - 1;
    uVar11 = iVar10 >> (1U - (char)biasRight & 0x1f);
    pCur->aiIdx[cVar1] = (u16)uVar11;
    if (local_88 == (code *)0x0) {
      puVar7 = pMVar6->aDataOfst;
      uVar4 = pMVar6->maskPage;
      puVar8 = pMVar6->aCellIdx;
      uVar3 = pMVar6->intKeyLeaf;
      uVar16 = 0;
      do {
        p = puVar7 + (CONCAT11(puVar8[(long)(int)uVar11 * 2],puVar8[(long)(int)uVar11 * 2 + 1]) &
                     uVar4);
        if (uVar3 != '\0') {
          while ((char)*p < '\0') {
            p = p + 1;
            if (pMVar6->aDataEnd <= p) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfa1e,
                          "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
              return 0xb;
            }
          }
          p = p + 1;
        }
        sqlite3GetVarint(p,&local_38);
        uVar15 = uVar11;
        if ((long)local_38 < intKey) {
          uVar16 = uVar11 + 1;
          if (iVar10 <= (int)uVar11) goto LAB_00136753;
        }
        else {
          if ((long)local_38 <= intKey) {
            pCur->aiIdx[cVar1] = (u16)uVar11;
            if (pMVar6->leaf != '\0') {
              pCur->curFlags = pCur->curFlags | 2;
              (pCur->info).nKey = local_38;
              (pCur->info).nSize = 0;
              *pRes = 0;
              return 0;
            }
            goto LAB_001366f0;
          }
          if ((int)uVar11 <= (int)uVar16) {
            iVar12 = 1;
            uVar11 = uVar16;
            goto LAB_001366e5;
          }
          iVar10 = uVar11 - 1;
        }
        uVar11 = (int)(uVar16 + iVar10) >> 1;
      } while( true );
    }
    uVar16 = 0;
    do {
      puVar7 = pMVar6->aDataOfst;
      uVar14 = (ulong)(CONCAT11(pMVar6->aCellIdx[(long)(int)uVar11 * 2],
                                pMVar6->aCellIdx[(long)(int)uVar11 * 2 + 1]) & pMVar6->maskPage);
      pbVar13 = puVar7 + uVar14 + 1;
      bVar2 = puVar7[uVar14];
      uVar15 = (uint)bVar2;
      if (pMVar6->max1bytePayload < bVar2) {
        if ((-1 < (char)*pbVar13) &&
           (uVar15 = (bVar2 & 0x7f) << 7 | (int)(char)*pbVar13, uVar15 <= pMVar6->maxLocal)) {
          pbVar13 = puVar7 + uVar14 + 2;
          goto LAB_001365d7;
        }
        (*pMVar6->xParseCell)(pMVar6,puVar7 + (uVar14 - pMVar6->childPtrSize),&pCur->info);
        uVar14 = (pCur->info).nKey;
        amt = (u32)uVar14;
        if ((int)amt < 2) {
          iVar12 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfa67,
                      "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
          goto LAB_001368a3;
        }
        pBuf = (uchar *)sqlite3Malloc((ulong)(amt + 0x12));
        if (pBuf == (uchar *)0x0) {
          iVar12 = 7;
          goto LAB_001368a3;
        }
        pCur->aiIdx[pCur->iPage] = (u16)uVar11;
        iVar12 = accessPayload(pCur,0,amt,pBuf,0);
        pCur->curFlags = pCur->curFlags & 0xfb;
        if (iVar12 != 0) {
          sqlite3_free(pBuf);
          goto LAB_001368a3;
        }
        iVar12 = (*local_88)(uVar14 & 0xffffffff,pBuf,pIdxKey);
        sqlite3_free(pBuf);
      }
      else {
LAB_001365d7:
        iVar12 = (*local_88)(uVar15,pbVar13,pIdxKey);
      }
      if (iVar12 < 0) {
        uVar16 = uVar11 + 1;
      }
      else {
        if (iVar12 == 0) {
          *pRes = 0;
          pCur->aiIdx[pCur->iPage] = (u16)uVar11;
          iVar12 = 0xb;
          if (pIdxKey->errCode == '\0') {
            iVar12 = 0;
          }
          goto LAB_001368a3;
        }
        iVar10 = uVar11 - 1;
      }
      uVar15 = uVar11;
      uVar11 = uVar16;
      if (iVar10 < (int)uVar16) goto LAB_001366e5;
      uVar11 = iVar10 + uVar16 >> 1;
    } while( true );
  }
LAB_00136821:
  *pRes = -1;
  return 0;
LAB_00136753:
  iVar12 = -1;
  uVar11 = uVar16;
LAB_001366e5:
  if (pMVar6->leaf != '\0') {
    pCur->aiIdx[pCur->iPage] = (u16)uVar15;
    *pRes = iVar12;
    iVar12 = 0;
    goto LAB_001368a3;
  }
LAB_001366f0:
  if ((int)uVar11 < (int)(uint)pMVar6->nCell) {
    uVar14 = (ulong)(CONCAT11(pMVar6->aCellIdx[(long)(int)uVar11 * 2],
                              pMVar6->aCellIdx[(long)(int)uVar11 * 2 + 1]) & pMVar6->maskPage);
  }
  else {
    uVar14 = (ulong)pMVar6->hdrOffset + 8;
  }
  uVar16 = *(uint *)(pMVar6->aData + uVar14);
  pCur->aiIdx[pCur->iPage] = (u16)uVar11;
  iVar12 = moveToChild(pCur,uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                            uVar16 << 0x18);
  if (iVar12 != 0) {
LAB_001368a3:
    (pCur->info).nSize = 0;
    return iVar12;
  }
  goto LAB_001364a4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeMovetoUnpacked(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  i64 intKey,              /* The table key */
  int biasRight,           /* If true, bias the search to the high end */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( (pIdxKey==0)==(pCur->pKeyInfo==0) );
  assert( pCur->eState!=CURSOR_VALID || (pIdxKey==0)==(pCur->curIntKey!=0) );

  /* If the cursor is already positioned at the point we are trying
  ** to move to, then just return without doing any work */
  if( pIdxKey==0
   && pCur->eState==CURSOR_VALID && (pCur->curFlags & BTCF_ValidNKey)!=0
  ){
    if( pCur->info.nKey==intKey ){
      *pRes = 0;
      return SQLITE_OK;
    }
    if( pCur->info.nKey<intKey ){
      if( (pCur->curFlags & BTCF_AtLast)!=0 ){
        *pRes = -1;
        return SQLITE_OK;
      }
      /* If the requested key is one more than the previous key, then
      ** try to get there using sqlite3BtreeNext() rather than a full
      ** binary search.  This is an optimization only.  The correct answer
      ** is still obtained without this ase, only a little more slowely */
      if( pCur->info.nKey+1==intKey && !pCur->skipNext ){
        *pRes = 0;
        rc = sqlite3BtreeNext(pCur, pRes);
        if( rc ) return rc;
        if( *pRes==0 ){
          getCellInfo(pCur);
          if( pCur->info.nKey==intKey ){
            return SQLITE_OK;
          }
        }
      }
    }
  }

  if( pIdxKey ){
    xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
    pIdxKey->errCode = 0;
    assert( pIdxKey->default_rc==1 
         || pIdxKey->default_rc==0 
         || pIdxKey->default_rc==-1
    );
  }else{
    xRecordCompare = 0; /* All keys are integers */
  }

  rc = moveToRoot(pCur);
  if( rc ){
    return rc;
  }
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage] );
  assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->isInit );
  assert( pCur->eState==CURSOR_INVALID || pCur->apPage[pCur->iPage]->nCell>0 );
  if( pCur->eState==CURSOR_INVALID ){
    *pRes = -1;
    assert( pCur->pgnoRoot==0 || pCur->apPage[pCur->iPage]->nCell==0 );
    return SQLITE_OK;
  }
  assert( pCur->apPage[0]->intKey==pCur->curIntKey );
  assert( pCur->curIntKey || pIdxKey );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->apPage[pCur->iPage];
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==(pIdxKey==0) );
    lwr = 0;
    upr = pPage->nCell-1;
    assert( biasRight==0 || biasRight==1 );
    idx = upr>>(1-biasRight); /* idx = biasRight ? upr : (lwr+upr)/2; */
    pCur->aiIdx[pCur->iPage] = (u16)idx;
    if( xRecordCompare==0 ){
      for(;;){
        i64 nCellKey;
        pCell = findCellPastPtr(pPage, idx);
        if( pPage->intKeyLeaf ){
          while( 0x80 <= *(pCell++) ){
            if( pCell>=pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
          }
        }
        getVarint(pCell, (u64*)&nCellKey);
        if( nCellKey<intKey ){
          lwr = idx+1;
          if( lwr>upr ){ c = -1; break; }
        }else if( nCellKey>intKey ){
          upr = idx-1;
          if( lwr>upr ){ c = +1; break; }
        }else{
          assert( nCellKey==intKey );
          pCur->aiIdx[pCur->iPage] = (u16)idx;
          if( !pPage->leaf ){
            lwr = idx;
            goto moveto_next_layer;
          }else{
            pCur->curFlags |= BTCF_ValidNKey;
            pCur->info.nKey = nCellKey;
            pCur->info.nSize = 0;
            *pRes = 0;
            return SQLITE_OK;
          }
        }
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2; */
      }
    }else{
      for(;;){
        int nCell;  /* Size of the pCell cell in bytes */
        pCell = findCellPastPtr(pPage, idx);

        /* The maximum supported page-size is 65536 bytes. This means that
        ** the maximum number of record bytes stored on an index B-Tree
        ** page is less than 16384 bytes and may be stored as a 2-byte
        ** varint. This information is used to attempt to avoid parsing 
        ** the entire cell by checking for the cases where the record is 
        ** stored entirely within the b-tree page by inspecting the first 
        ** 2 bytes of the cell.
        */
        nCell = pCell[0];
        if( nCell<=pPage->max1bytePayload ){
          /* This branch runs if the record-size field of the cell is a
          ** single byte varint and the record fits entirely on the main
          ** b-tree page.  */
          testcase( pCell+nCell+1==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
        }else if( !(pCell[1] & 0x80) 
          && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
        ){
          /* The record-size field is a 2 byte varint and the record 
          ** fits entirely on the main b-tree page.  */
          testcase( pCell+nCell+2==pPage->aDataEnd );
          c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
        }else{
          /* The record flows over onto one or more overflow pages. In
          ** this case the whole cell needs to be parsed, a buffer allocated
          ** and accessPayload() used to retrieve the record into the
          ** buffer before VdbeRecordCompare() can be called. 
          **
          ** If the record is corrupt, the xRecordCompare routine may read
          ** up to two varints past the end of the buffer. An extra 18 
          ** bytes of padding is allocated at the end of the buffer in
          ** case this happens.  */
          void *pCellKey;
          u8 * const pCellBody = pCell - pPage->childPtrSize;
          pPage->xParseCell(pPage, pCellBody, &pCur->info);
          nCell = (int)pCur->info.nKey;
          testcase( nCell<0 );   /* True if key size is 2^32 or more */
          testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
          testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
          testcase( nCell==2 );  /* Minimum legal index key size */
          if( nCell<2 ){
            rc = SQLITE_CORRUPT_BKPT;
            goto moveto_finish;
          }
          pCellKey = sqlite3Malloc( nCell+18 );
          if( pCellKey==0 ){
            rc = SQLITE_NOMEM_BKPT;
            goto moveto_finish;
          }
          pCur->aiIdx[pCur->iPage] = (u16)idx;
          rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
          pCur->curFlags &= ~BTCF_ValidOvfl;
          if( rc ){
            sqlite3_free(pCellKey);
            goto moveto_finish;
          }
          c = xRecordCompare(nCell, pCellKey, pIdxKey);
          sqlite3_free(pCellKey);
        }
        assert( 
            (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
         && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
        );
        if( c<0 ){
          lwr = idx+1;
        }else if( c>0 ){
          upr = idx-1;
        }else{
          assert( c==0 );
          *pRes = 0;
          rc = SQLITE_OK;
          pCur->aiIdx[pCur->iPage] = (u16)idx;
          if( pIdxKey->errCode ) rc = SQLITE_CORRUPT;
          goto moveto_finish;
        }
        if( lwr>upr ) break;
        assert( lwr+upr>=0 );
        idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
      }
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->aiIdx[pCur->iPage]<pCur->apPage[pCur->iPage]->nCell );
      pCur->aiIdx[pCur->iPage] = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_finish;
    }
moveto_next_layer:
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->aiIdx[pCur->iPage] = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}